

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void save_load_svm_model(svm_params *params,io_buf *model_file,bool read,bool text)

{
  size_t sVar1;
  float **read_message;
  stringstream *msg_00;
  byte in_CL;
  byte bVar2;
  uint uVar3;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  svm_example *tmp;
  uint32_t i;
  flat_example *fec;
  stringstream msg;
  svm_model *model;
  undefined4 in_stack_fffffffffffffdec;
  svm_example *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  stringstream *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined1 uVar5;
  long lVar4;
  undefined1 read_00;
  char *in_stack_fffffffffffffe10;
  svm_example **in_stack_fffffffffffffe18;
  svm_example *in_stack_fffffffffffffe20;
  io_buf *io;
  uint local_1c4;
  stringstream local_1a8 [32];
  flat_example **in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe87;
  io_buf *in_stack_fffffffffffffe88;
  size_t in_stack_ffffffffffffffd8;
  v_array<svm_example_*> *this;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffe08 >> 0x38);
  bVar2 = in_DL & 1;
  this = *(v_array<svm_example_*> **)(in_RDI + 0x38);
  sVar1 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar1 != 0) {
    io = (io_buf *)local_1a8;
    std::__cxx11::stringstream::stringstream((stringstream *)io);
    uVar3 = (uint)(in_CL & 1);
    bin_text_read_write_fixed
              (io,(char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10,(bool)uVar5,in_stack_fffffffffffffe00,
               SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    if (bVar2 != 0) {
      v_array<svm_example_*>::resize(this,in_stack_ffffffffffffffd8);
    }
    for (local_1c4 = 0; uVar5 = (undefined1)((ulong)in_stack_fffffffffffffdf8 >> 0x38),
        (svm_example **)(ulong)local_1c4 < this->_begin; local_1c4 = local_1c4 + 1) {
      if (bVar2 == 0) {
        in_stack_fffffffffffffe18 =
             v_array<svm_example_*>::operator[]
                       ((v_array<svm_example_*> *)&this->_end,(ulong)local_1c4);
        save_load_flat_example
                  (in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87,
                   in_stack_fffffffffffffe78);
      }
      else {
        save_load_flat_example
                  (in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87,
                   in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe20 = calloc_or_throw<svm_example>();
        svm_example::init_svm_example
                  (in_stack_fffffffffffffdf0,
                   (flat_example *)CONCAT44(in_stack_fffffffffffffdec,uVar3));
        v_array<svm_example_*>::push_back
                  ((v_array<svm_example_*> *)in_stack_fffffffffffffdf0,
                   (svm_example **)CONCAT44(in_stack_fffffffffffffdec,uVar3));
      }
    }
    if (bVar2 != 0) {
      v_array<float>::resize((v_array<float> *)this,in_stack_ffffffffffffffd8);
    }
    lVar4 = in_RSI;
    read_message = v_array<float>::begin((v_array<float> *)&this[1]._end);
    read_00 = (undefined1)((ulong)lVar4 >> 0x38);
    bin_text_read_write_fixed
              (io,(char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
               (char *)read_message,(bool)read_00,in_stack_fffffffffffffe00,(bool)uVar5);
    if (bVar2 != 0) {
      v_array<float>::resize((v_array<float> *)this,in_stack_ffffffffffffffd8);
    }
    msg_00 = (stringstream *)v_array<float>::begin((v_array<float> *)&this[2]._end);
    bin_text_read_write_fixed
              (io,(char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
               (char *)read_message,(bool)read_00,msg_00,SUB81((ulong)in_RSI >> 0x38,0));
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

void save_load_svm_model(svm_params& params, io_buf& model_file, bool read, bool text)
{
  svm_model* model = params.model;
  // TODO: check about initialization

  // params.all->opts_n_args.trace_message<<"Save load svm "<<read<<" "<<text<<endl;
  if (model_file.files.size() == 0)
    return;
  stringstream msg;
  bin_text_read_write_fixed(model_file, (char*)&(model->num_support), sizeof(model->num_support), "", read, msg, text);
  // params.all->opts_n_args.trace_message<<"Read num support "<<model->num_support<<endl;

  flat_example* fec = nullptr;
  if (read)
    model->support_vec.resize(model->num_support);

  for (uint32_t i = 0; i < model->num_support; i++)
  {
    if (read)
    {
      save_load_flat_example(model_file, read, fec);
      svm_example* tmp = &calloc_or_throw<svm_example>();
      tmp->init_svm_example(fec);
      model->support_vec.push_back(tmp);
    }
    else
    {
      fec = &(model->support_vec[i]->ex);
      save_load_flat_example(model_file, read, fec);
    }
  }

  if (read)
    model->alpha.resize(model->num_support);
  bin_text_read_write_fixed(
      model_file, (char*)model->alpha.begin(), (uint32_t)model->num_support * sizeof(float), "", read, msg, text);
  if (read)
    model->delta.resize(model->num_support);
  bin_text_read_write_fixed(
      model_file, (char*)model->delta.begin(), (uint32_t)model->num_support * sizeof(float), "", read, msg, text);
}